

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void test_invoke_obj<int_const,true,int_C::*const&,D_const>(long r,long *param_2,long param_3)

{
  test_context context;
  test_context context_00;
  undefined4 uStack_44;
  undefined4 uStack_2c;
  
  context._12_4_ = uStack_2c;
  context.line = 0x7d;
  context.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context.expr = 
  "::addressof(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r)";
  test_check(*param_2 + param_3 == r,context);
  context_00._12_4_ = uStack_44;
  context_00.line = 0x7e;
  context_00.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_00.expr =
       "::addressof(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r)"
  ;
  test_check(param_3 + *param_2 == r,context_00);
  test_report_info<void>::checks = test_report_info<void>::checks + 6;
  return;
}

Assistant:

void test_invoke_obj(
    R&& r, std::integral_constant<bool, IsNothrow>,
    F&& f, A1&& a1)
{
    CHECK(::addressof(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r));
    CHECK(::addressof(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r));
    CHECK(std::is_same<decltype(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value);
    CHECK(std::is_same<decltype(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value);
    CHECK(std::is_same<decltype(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))), void>::value);
    CHECK(noexcept(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
    CHECK(noexcept(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
    CHECK(noexcept(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
}